

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void __thiscall
flatbuffers::php::PhpGenerator::GenStruct(PhpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  bool bVar1;
  long lVar2;
  reference ppFVar3;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_2e0;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  PhpGenerator *this_local;
  
  if (((struct_def->super_Definition).generated & 1U) == 0) {
    code = code_ptr;
    code_ptr_local = (string *)struct_def;
    struct_def_local = (StructDef *)this;
    GenComment(&(struct_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    BeginClass((StructDef *)code_ptr_local,code);
    if ((code_ptr_local[8].field_2._M_local_buf[0] & 1U) == 0) {
      NewRootTypeFromBuffer((StructDef *)code_ptr_local,code);
    }
    local_28 = code;
    if ((code_ptr_local[8].field_2._M_local_buf[0] & 1U) == 0) {
      lVar2 = std::__cxx11::string::length();
      if (lVar2 != 0) {
        std::operator+(&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"public static function ");
        std::operator+(&local_48,&local_68,code_ptr_local);
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::operator+=((string *)local_28,"Identifier()\n");
        std::operator+(&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"{\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::operator+(&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_);
        std::operator+(&local_b8,&local_d8,"return \"");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::operator+(&local_f8,&((this->super_BaseGenerator).parser_)->file_identifier_,"\";\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::operator+(&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"}\n\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::operator+(&local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"public static function ");
        std::operator+(&local_138,&local_158,code_ptr_local);
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::operator+=
                  ((string *)local_28,"BufferHasIdentifier(ByteBuffer $buf)\n");
        std::operator+(&local_178,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"{\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::operator+(&local_1b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_);
        std::operator+(&local_198,&local_1b8,"return self::");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::operator+=((string *)local_28,"__has_identifier($buf, self::");
        std::operator+(&local_1d8,code_ptr_local,"Identifier());\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::operator+(&local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"}\n\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
      }
      lVar2 = std::__cxx11::string::length();
      if (lVar2 != 0) {
        std::operator+(&local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"public static function ");
        std::operator+(&local_218,&local_238,code_ptr_local);
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::operator+=((string *)local_28,"Extension()\n");
        std::operator+(&local_258,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"{\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::operator+(&local_2b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_);
        std::operator+(&local_298,&local_2b8,"return \"");
        std::operator+(&local_278,&local_298,&((this->super_BaseGenerator).parser_)->file_extension_
                      );
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::operator+=((string *)local_28,"\";\n");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       Indent_abi_cxx11_,"}\n\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&it);
        std::__cxx11::string::~string((string *)&it);
      }
    }
    InitializeExisting((StructDef *)code_ptr_local,code);
    local_2e0._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                    ((long)&code_ptr_local[7].field_2 + 8));
    while( true ) {
      field = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)((long)&code_ptr_local[7].field_2 + 8));
      bVar1 = __gnu_cxx::operator!=
                        (&local_2e0,
                         (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field);
      if (!bVar1) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_2e0);
      if (((*ppFVar3)->deprecated & 1U) == 0) {
        GenStructAccessor(this,(StructDef *)code_ptr_local,*ppFVar3,code);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_2e0);
    }
    if ((code_ptr_local[8].field_2._M_local_buf[0] & 1U) == 0) {
      GenTableBuilders(this,(StructDef *)code_ptr_local,code);
    }
    else {
      GenStructBuilder((StructDef *)code_ptr_local,code);
    }
    EndClass(code);
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;

    GenComment(struct_def.doc_comment, code_ptr, nullptr);
    BeginClass(struct_def, code_ptr);

    if (!struct_def.fixed) {
      // Generate a special accessor for the table that has been declared as
      // the root type.
      NewRootTypeFromBuffer(struct_def, code_ptr);
    }

    std::string &code = *code_ptr;
    if (!struct_def.fixed) {
      if (parser_.file_identifier_.length()) {
        // Return the identifier
        code += Indent + "public static function " + struct_def.name;
        code += "Identifier()\n";
        code += Indent + "{\n";
        code += Indent + Indent + "return \"";
        code += parser_.file_identifier_ + "\";\n";
        code += Indent + "}\n\n";

        // Check if a buffer has the identifier.
        code += Indent + "public static function " + struct_def.name;
        code += "BufferHasIdentifier(ByteBuffer $buf)\n";
        code += Indent + "{\n";
        code += Indent + Indent + "return self::";
        code += "__has_identifier($buf, self::";
        code += struct_def.name + "Identifier());\n";
        code += Indent + "}\n\n";
      }

      if (parser_.file_extension_.length()) {
        // Return the extension
        code += Indent + "public static function " + struct_def.name;
        code += "Extension()\n";
        code += Indent + "{\n";
        code += Indent + Indent + "return \"" + parser_.file_extension_;
        code += "\";\n";
        code += Indent + "}\n\n";
      }
    }

    // Generate the Init method that sets the field in a pre-existing
    // accessor object. This is to allow object reuse.
    InitializeExisting(struct_def, code_ptr);
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      GenStructAccessor(struct_def, field, code_ptr);
    }

    if (struct_def.fixed) {
      // create a struct constructor function
      GenStructBuilder(struct_def, code_ptr);
    } else {
      // Create a set of functions that allow table construction.
      GenTableBuilders(struct_def, code_ptr);
    }
    EndClass(code_ptr);
  }